

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O2

void ncnn::quantize(float *ptr,char *s8ptr,Mat *scale_data,int elemcount,int elempack)

{
  float fVar1;
  undefined1 (*pauVar2) [32];
  ulong uVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  float fVar12;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar13 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 in_ZMM7 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [16];
  undefined1 in_ZMM8 [64];
  undefined1 auVar37 [64];
  undefined1 auVar9 [28];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar36 [32];
  
  pauVar2 = (undefined1 (*) [32])scale_data->data;
  fVar1 = *(float *)*pauVar2;
  auVar8._4_4_ = fVar1;
  auVar8._0_4_ = fVar1;
  auVar8._8_4_ = fVar1;
  auVar8._12_4_ = fVar1;
  auVar9._16_4_ = fVar1;
  auVar9._0_16_ = auVar8;
  auVar9._20_4_ = fVar1;
  auVar9._24_4_ = fVar1;
  if (1 < scale_data->w) {
    if (elempack == 4) {
      auVar8 = *(undefined1 (*) [16])*pauVar2;
      auVar11._16_16_ = auVar8;
      auVar11._0_16_ = auVar8;
      auVar9 = auVar11._0_28_;
    }
    else if (elempack == 8) {
      auVar9 = SUB3228(*pauVar2,0);
    }
  }
  iVar5 = elempack * elemcount;
  uVar3 = 0;
  auVar21._8_4_ = 0x80000000;
  auVar21._0_8_ = 0x8000000080000000;
  auVar21._12_4_ = 0x80000000;
  auVar21._16_4_ = 0x80000000;
  auVar21._20_4_ = 0x80000000;
  auVar21._24_4_ = 0x80000000;
  auVar21._28_4_ = 0x80000000;
  auVar24._8_4_ = 0x3f000000;
  auVar24._0_8_ = 0x3f0000003f000000;
  auVar24._12_4_ = 0x3f000000;
  auVar24._16_4_ = 0x3f000000;
  auVar24._20_4_ = 0x3f000000;
  auVar24._24_4_ = 0x3f000000;
  auVar24._28_4_ = 0x3f000000;
  auVar25._8_4_ = 0x7f007f;
  auVar25._0_8_ = 0x7f007f007f007f;
  auVar25._12_4_ = 0x7f007f;
  auVar27._8_4_ = 0xff81ff81;
  auVar27._0_8_ = 0xff81ff81ff81ff81;
  auVar27._12_4_ = 0xff81ff81;
  while( true ) {
    fVar12 = auVar9._0_4_;
    fVar14 = auVar9._4_4_;
    fVar15 = auVar9._8_4_;
    fVar16 = auVar9._12_4_;
    fVar17 = auVar9._16_4_;
    fVar18 = auVar9._20_4_;
    fVar19 = auVar9._24_4_;
    if (iVar5 <= (int)uVar3 + 0xf) break;
    auVar33._0_4_ = fVar12 * *ptr;
    auVar33._4_4_ = fVar14 * ptr[1];
    auVar33._8_4_ = fVar15 * ptr[2];
    auVar33._12_4_ = fVar16 * ptr[3];
    auVar33._16_4_ = fVar17 * ptr[4];
    auVar33._20_4_ = fVar18 * ptr[5];
    auVar33._28_36_ = in_ZMM7._28_36_;
    auVar33._24_4_ = fVar19 * ptr[6];
    auVar37._0_4_ = fVar12 * ptr[8];
    auVar37._4_4_ = fVar14 * ptr[9];
    auVar37._8_4_ = fVar15 * ptr[10];
    auVar37._12_4_ = fVar16 * ptr[0xb];
    auVar37._16_4_ = fVar17 * ptr[0xc];
    auVar37._20_4_ = fVar18 * ptr[0xd];
    auVar37._28_36_ = in_ZMM8._28_36_;
    auVar37._24_4_ = fVar19 * ptr[0xe];
    auVar11 = vandps_avx(auVar33._0_32_,auVar21);
    auVar32 = vandps_avx(auVar37._0_32_,auVar21);
    auVar11 = vorps_avx(auVar11,auVar24);
    auVar32 = vorps_avx(auVar32,auVar24);
    auVar29._0_4_ = (int)(auVar11._0_4_ + auVar33._0_4_);
    auVar29._4_4_ = (int)(auVar11._4_4_ + auVar33._4_4_);
    auVar29._8_4_ = (int)(auVar11._8_4_ + auVar33._8_4_);
    auVar29._12_4_ = (int)(auVar11._12_4_ + auVar33._12_4_);
    auVar31._16_4_ = (int)(auVar11._16_4_ + auVar33._16_4_);
    auVar31._0_16_ = auVar29;
    auVar31._20_4_ = (int)(auVar11._20_4_ + auVar33._20_4_);
    auVar31._24_4_ = (int)(auVar11._24_4_ + auVar33._24_4_);
    auVar31._28_4_ = (int)(auVar11._28_4_ + in_ZMM7._28_4_);
    auVar35._0_4_ = (int)(auVar37._0_4_ + auVar32._0_4_);
    auVar35._4_4_ = (int)(auVar37._4_4_ + auVar32._4_4_);
    auVar35._8_4_ = (int)(auVar37._8_4_ + auVar32._8_4_);
    auVar35._12_4_ = (int)(auVar37._12_4_ + auVar32._12_4_);
    auVar36._16_4_ = (int)(auVar37._16_4_ + auVar32._16_4_);
    auVar36._0_16_ = auVar35;
    auVar36._20_4_ = (int)(auVar37._20_4_ + auVar32._20_4_);
    auVar36._24_4_ = (int)(auVar37._24_4_ + auVar32._24_4_);
    auVar36._28_4_ = (int)(in_ZMM8._28_4_ + auVar32._28_4_);
    auVar26 = vpackssdw_avx(auVar29,auVar31._16_16_);
    auVar28 = vpackssdw_avx(auVar35,auVar36._16_16_);
    auVar26 = vpminsw_avx(auVar26,auVar25);
    auVar28 = vpminsw_avx(auVar28,auVar25);
    auVar26 = vpmaxsw_avx(auVar26,auVar27);
    auVar28 = vpmaxsw_avx(auVar28,auVar27);
    in_ZMM8 = ZEXT1664(auVar28);
    auVar26 = vpacksswb_avx(auVar26,auVar28);
    in_ZMM7 = ZEXT1664(auVar26);
    *(undefined1 (*) [16])(s8ptr + uVar3) = auVar26;
    ptr = ptr + 0x10;
    uVar3 = uVar3 + 0x10;
  }
  auVar26._8_4_ = 0x7f007f;
  auVar26._0_8_ = 0x7f007f007f007f;
  auVar26._12_4_ = 0x7f007f;
  auVar28._8_4_ = 0xff81ff81;
  auVar28._0_8_ = 0xff81ff81ff81ff81;
  auVar28._12_4_ = 0xff81ff81;
  for (; (int)uVar3 + 7 < iVar5; uVar3 = uVar3 + 8) {
    auVar34._0_4_ = fVar12 * *ptr;
    auVar34._4_4_ = fVar14 * ptr[1];
    auVar34._8_4_ = fVar15 * ptr[2];
    auVar34._12_4_ = fVar16 * ptr[3];
    auVar34._16_4_ = fVar17 * ptr[4];
    auVar34._20_4_ = fVar18 * ptr[5];
    auVar34._28_36_ = in_ZMM7._28_36_;
    auVar34._24_4_ = fVar19 * ptr[6];
    auVar11 = vandps_avx(auVar34._0_32_,auVar21);
    auVar11 = vorps_avx(auVar11,auVar24);
    auVar30._0_4_ = (int)(auVar11._0_4_ + auVar34._0_4_);
    auVar30._4_4_ = (int)(auVar11._4_4_ + auVar34._4_4_);
    auVar30._8_4_ = (int)(auVar11._8_4_ + auVar34._8_4_);
    auVar30._12_4_ = (int)(auVar11._12_4_ + auVar34._12_4_);
    auVar32._16_4_ = (int)(auVar11._16_4_ + auVar34._16_4_);
    auVar32._0_16_ = auVar30;
    auVar32._20_4_ = (int)(auVar11._20_4_ + auVar34._20_4_);
    auVar32._24_4_ = (int)(auVar11._24_4_ + auVar34._24_4_);
    auVar32._28_4_ = (int)(auVar11._28_4_ + in_ZMM7._28_4_);
    auVar25 = vpackssdw_avx(auVar30,auVar32._16_16_);
    auVar25 = vpminsw_avx(auVar25,auVar26);
    auVar25 = vpmaxsw_avx(auVar25,auVar28);
    auVar25 = vpacksswb_avx(auVar25,auVar25);
    in_ZMM7 = ZEXT1664(auVar25);
    *(long *)(s8ptr + uVar3) = auVar25._0_8_;
    ptr = ptr + 8;
  }
  auVar13._8_4_ = 0x80000000;
  auVar13._0_8_ = 0x8000000080000000;
  auVar13._12_4_ = 0x80000000;
  auVar20._8_4_ = 0x3f000000;
  auVar20._0_8_ = 0x3f0000003f000000;
  auVar20._12_4_ = 0x3f000000;
  for (; (int)uVar3 + 3 < iVar5; uVar3 = uVar3 + 4) {
    auVar22._0_4_ = auVar8._0_4_ * *ptr;
    auVar22._4_4_ = auVar8._4_4_ * ptr[1];
    auVar22._8_4_ = auVar8._8_4_ * ptr[2];
    auVar22._12_4_ = auVar8._12_4_ * ptr[3];
    auVar25 = vandps_avx(auVar22,auVar13);
    auVar25 = vorps_avx(auVar25,auVar20);
    auVar23._0_4_ = (int)(auVar22._0_4_ + auVar25._0_4_);
    auVar23._4_4_ = (int)(auVar22._4_4_ + auVar25._4_4_);
    auVar23._8_4_ = (int)(auVar22._8_4_ + auVar25._8_4_);
    auVar23._12_4_ = (int)(auVar22._12_4_ + auVar25._12_4_);
    auVar25 = vpackssdw_avx(auVar23,auVar23);
    auVar25 = vpminsw_avx(auVar25,auVar26);
    auVar25 = vpmaxsw_avx(auVar25,auVar28);
    auVar25 = vpacksswb_avx(auVar25,auVar25);
    *(int *)(s8ptr + uVar3) = auVar25._0_4_;
    ptr = ptr + 4;
  }
  lVar4 = 0;
  auVar10._8_4_ = 0x3effffff;
  auVar10._0_8_ = 0x3effffff3effffff;
  auVar10._12_4_ = 0x3effffff;
  for (uVar6 = uVar3 & 0xffffffff; (int)uVar6 < iVar5; uVar6 = (ulong)((int)uVar6 + 1)) {
    auVar8 = vandps_avx(ZEXT416((uint)(fVar1 * ptr[lVar4])),auVar13);
    auVar8 = vorps_avx(auVar8,auVar10);
    auVar8 = ZEXT416((uint)(fVar1 * ptr[lVar4] + auVar8._0_4_));
    auVar8 = vroundss_avx(auVar8,auVar8,0xb);
    iVar7 = (int)auVar8._0_4_;
    if (iVar7 < -0x7e) {
      iVar7 = -0x7f;
    }
    if (0x7e < iVar7) {
      iVar7 = 0x7f;
    }
    s8ptr[uVar3 + lVar4] = (char)iVar7;
    lVar4 = lVar4 + 1;
  }
  return;
}

Assistant:

NCNN_FORCEINLINE const float& Mat::operator[](size_t i) const
{
    return ((const float*)data)[i];
}